

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_layout.cc
# Opt level: O3

Ops * __thiscall Typelib::MemoryLayout::simplifyInit(Ops *__return_storage_ptr__,MemoryLayout *this)

{
  const_iterator cVar1;
  runtime_error *this_00;
  MemoryLayout result;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  MemoryLayout local_58;
  
  local_58.init_ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.init_ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.init_ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  cVar1 = simplifyInit(this,(const_iterator)
                            (this->init_ops).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                       (const_iterator)
                       (this->init_ops).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_58,true);
  if (cVar1._M_current ==
      (this->init_ops).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if ((((long)local_58.init_ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_58.init_ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start == 0x10) &&
        (local_58.init_ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
         .super__Vector_impl_data._M_finish !=
         local_58.init_ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
         .super__Vector_impl_data._M_start)) &&
       (*local_58.init_ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
         .super__Vector_impl_data._M_start == 3)) {
      local_58.init_ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_58.init_ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (__return_storage_ptr__,&local_58.init_ops);
    if (local_58.init_ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.init_ops.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_58.ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"simplifyInit() did not reach the end","");
  std::runtime_error::runtime_error(this_00,(string *)local_78);
  *(undefined ***)this_00 = &PTR__runtime_error_0015d3a8;
  __cxa_throw(this_00,&InvalidMemoryLayout::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

MemoryLayout::Ops MemoryLayout::simplifyInit() const
{
    MemoryLayout result;
    const_iterator end = simplifyInit(init_begin(), init_end(), result, true);
    if (end != init_end())
        throw InvalidMemoryLayout("simplifyInit() did not reach the end");

    MemoryLayout::Ops& simplified = result.init_ops;
    if (simplified.size() == 2 && simplified[0] == FLAG_INIT_SKIP)
        simplified.clear();
    return simplified;
}